

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

void __thiscall CVmDynamicFunc::save_to_file(CVmDynamicFunc *this,CVmFile *fp)

{
  vm_dynfunc_ext *this_00;
  CVmFile *in_RSI;
  CVmDynamicFunc *in_RDI;
  int i;
  vm_dynfunc_ext *ext;
  char buf [5];
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  CVmFile *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar1;
  
  this_00 = get_ext(in_RDI);
  CVmFile::write_uint2(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  CVmFile::write_uint2(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  vmb_put_dh((char *)in_stack_ffffffffffffffd0,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (size_t)in_stack_ffffffffffffffd0);
  vmb_put_dh((char *)in_stack_ffffffffffffffd0,
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
             (size_t)in_stack_ffffffffffffffd0);
  vm_dynfunc_ext::get_bytecode_ptr((vm_dynfunc_ext *)0x2db8e2);
  CVmFile::write_bytes
            ((CVmFile *)this_00,
             (char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),(size_t)in_RSI);
  for (iVar1 = 0; iVar1 < this_00->obj_ref_cnt; iVar1 = iVar1 + 1) {
    CVmFile::write_uint2(in_RSI,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void CVmDynamicFunc::save_to_file(VMG_ class CVmFile *fp)
{
    char buf[VMB_DATAHOLDER];
    vm_dynfunc_ext *ext = get_ext();

    /* write our source code length */
    fp->write_uint2(ext->bytecode_len);

    /* write our object reference count */
    fp->write_uint2(ext->obj_ref_cnt);

    /* write the method context object */
    vmb_put_dh(buf, &ext->method_ctx);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write our source object value */
    vmb_put_dh(buf, &ext->src);
    fp->write_bytes(buf, VMB_DATAHOLDER);

    /* write the bytecode data */
    fp->write_bytes(ext->get_bytecode_ptr(), ext->bytecode_len);

    /* write the object reference list */
    for (int i = 0 ; i < ext->obj_ref_cnt ; ++i)
        fp->write_uint2(ext->obj_refs[i]);
}